

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,hex_writer f)

{
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
  f_00;
  wchar_t wVar1;
  alignment aVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  undefined7 uStack_77;
  undefined4 uStack_5c;
  undefined1 local_54 [8];
  align_spec as;
  size_t padding;
  ulong uStack_38;
  char_type fill;
  size_t size;
  basic_format_specs<char> *spec_local;
  uint num_digits_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_local;
  string_view prefix_local;
  
  prefix_local.data_ = (char *)prefix.size_;
  this_local = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
               prefix.data_;
  sVar5 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  uStack_38 = sVar5 + num_digits;
  wVar1 = align_spec::fill(&spec->super_align_spec);
  padding._7_1_ = (undefined1)wVar1;
  as.fill_ = L'\0';
  as.align_ = ALIGN_DEFAULT;
  aVar2 = align_spec::align(&spec->super_align_spec);
  if (aVar2 == ALIGN_NUMERIC) {
    uVar3 = align_spec::width(&spec->super_align_spec);
    if (uStack_38 < uVar3) {
      uVar3 = align_spec::width(&spec->super_align_spec);
      as._4_8_ = uVar3 - uStack_38;
      uVar3 = align_spec::width(&spec->super_align_spec);
      uStack_38 = (ulong)uVar3;
    }
  }
  else {
    iVar4 = basic_format_specs<char>::precision(spec);
    if ((int)num_digits < iVar4) {
      sVar5 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
      iVar4 = basic_format_specs<char>::precision(spec);
      uStack_38 = sVar5 + (long)iVar4;
      iVar4 = basic_format_specs<char>::precision(spec);
      as._4_8_ = (long)iVar4 - (ulong)num_digits;
      padding._7_1_ = 0x30;
    }
  }
  local_54._0_4_ = (spec->super_align_spec).width_;
  local_54._4_4_ = (spec->super_align_spec).fill_;
  as.width_ = (spec->super_align_spec).align_;
  aVar2 = align_spec::align(&spec->super_align_spec);
  if (aVar2 == ALIGN_DEFAULT) {
    as.width_ = 2;
  }
  f_00._17_7_ = uStack_77;
  f_00.fill = padding._7_1_;
  f_00.f._12_4_ = uStack_5c;
  f_00.f.num_digits = f.num_digits;
  f_00.prefix.size_ = (size_t)prefix_local.data_;
  f_00.prefix.data_ = (char *)this_local;
  f_00.padding._0_4_ = as.fill_;
  f_00.padding._4_4_ = as.align_;
  f_00.f.self = f.self;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::hex_writer>>
            (this,uStack_38,(align_spec *)local_54,f_00);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }